

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Stress::anon_unknown_0::LongShaderGenerator::generateSource(LongShaderGenerator *this)

{
  bool bVar1;
  iterator first;
  iterator last;
  deUint32 local_204;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string expr;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e1;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inNames;
  string outName;
  size_t numVars;
  int numOps;
  bool isLast;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  uint local_14;
  LongShaderGenerator *pLStack_10;
  deUint32 currentOpsTotal;
  LongShaderGenerator *this_local;
  
  local_14 = 0;
  pLStack_10 = this;
  std::__cxx11::string::clear();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"#version 300 es",&local_39);
  addLine(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if ((this->m_spec).shaderType == SHADERTYPE_FRAGMENT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"layout(location = 0) out mediump vec4 o_fragColor;",&local_71);
    addLine(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numOps,"void main (void)",(allocator<char> *)((long)&numVars + 7));
  addLine(this,(string *)&numOps);
  std::__cxx11::string::~string((string *)&numOps);
  std::allocator<char>::~allocator((allocator<char> *)((long)&numVars + 7));
  beginBlock(this);
  while (local_14 < (this->m_spec).opsTotal) {
    numVars._6_1_ = (this->m_spec).opsTotal <= local_14 + (this->m_spec).opsPerExpression;
    if ((bool)numVars._6_1_) {
      local_204 = (this->m_spec).opsTotal - local_14;
    }
    else {
      local_204 = (this->m_spec).opsPerExpression;
    }
    numVars._0_4_ = local_204;
    if ((bool)numVars._6_1_) {
      Stress::(anonymous_namespace)::LongShaderGenerator::getShaderOutputName_abi_cxx11_
                ((string *)
                 &inNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
    }
    else {
      Stress::(anonymous_namespace)::LongShaderGenerator::getRandomVariableName_abi_cxx11_
                ((string *)
                 &inNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
    }
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_e1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e0,(long)(int)(local_204 + 1),&local_e1);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_e1);
    first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&this->m_varNames);
    last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->m_varNames);
    expr.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e0);
    de::Random::
    choose<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&this->m_rnd,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )last._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )expr.field_2._8_8_,local_204 + 1);
    makeExpression((string *)local_120,this,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e0,(deUint32)numVars);
    if ((numVars._6_1_ & 1) == 0) {
      std::operator+(&local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &inNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage," = ");
      std::operator+(&local_1c0,&local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      std::operator+(&local_1a0,&local_1c0,";");
      addLine(this,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    else {
      std::operator+(&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &inNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage," = vec4(");
      std::operator+(&local_160,&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      std::operator+(&local_140,&local_160,");");
      addLine(this,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
    }
    std::__cxx11::string::~string((string *)local_120);
    local_14 = (deUint32)numVars + local_14;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e0);
    std::__cxx11::string::~string
              ((string *)
               &inNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  while (bVar1 = std::
                 vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::empty(&this->m_scopes), ((bVar1 ^ 0xffU) & 1) != 0) {
    endBlock(this);
  }
  return;
}

Assistant:

void LongShaderGenerator::generateSource (void)
{
	deUint32 currentOpsTotal = 0;

	m_source.clear();

	addLine("#version 300 es");

	if (m_spec.shaderType == glu::SHADERTYPE_FRAGMENT)
		addLine("layout(location = 0) out mediump vec4 o_fragColor;");

	addLine("void main (void)");
	beginBlock();

	while (currentOpsTotal < m_spec.opsTotal)
	{
		const bool					isLast	= (m_spec.opsTotal <= (currentOpsTotal + m_spec.opsPerExpression));
		const int					numOps	= isLast ? (m_spec.opsTotal - currentOpsTotal) : m_spec.opsPerExpression;
		const size_t				numVars	= numOps + 1;

		const std::string			outName	= isLast ? getShaderOutputName() : getRandomVariableName();
		std::vector<std::string>	inNames	(numVars);

		DE_ASSERT(numVars < m_varNames.size());
		m_rnd.choose(m_varNames.begin(), m_varNames.end(), inNames.begin(), (int)numVars);

		{
			std::string expr = makeExpression(inNames, numOps);

			if (isLast)
				addLine(outName + " = vec4(" + expr + ");");
			else
				addLine(outName + " = " + expr + ";");
		}

		currentOpsTotal += numOps;
	}

	while (!m_scopes.empty())
		endBlock();
}